

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwGetWindowFrameSize(GLFWwindow *handle,int *left,int *top,int *right,int *bottom)

{
  Atom AVar1;
  int iVar2;
  unsigned_long uVar3;
  _GLFWwindow *window;
  int *piStack_1e8;
  int *piStack_1e0;
  int *piStack_1d8;
  int *piStack_1d0;
  int *piStack_1c8;
  double dStack_1c0;
  double dStack_1b8;
  timeval atStack_1b0 [2];
  undefined8 uStack_190;
  Atom AStack_188;
  undefined4 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined1 auStack_f0 [192];
  
  if (left != (int *)0x0) {
    *left = 0;
  }
  if (top != (int *)0x0) {
    *top = 0;
  }
  if (right != (int *)0x0) {
    *right = 0;
  }
  if (bottom != (int *)0x0) {
    *bottom = 0;
  }
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  piStack_1e8 = (int *)0x0;
  if (_glfw.x11.NET_FRAME_EXTENTS != 0) {
    piStack_1c8 = left;
    XGetWindowAttributes(_glfw.x11.display,*(undefined8 *)(handle + 0x288),atStack_1b0);
    AVar1 = _glfw.x11.NET_REQUEST_FRAME_EXTENTS;
    if (_glfw.x11.NET_REQUEST_FRAME_EXTENTS == 0 || uStack_158._4_4_ == 2) {
LAB_0010acf5:
      uVar3 = _glfwGetWindowProperty
                        (*(Window *)(handle + 0x288),_glfw.x11.NET_FRAME_EXTENTS,6,
                         (uchar **)&piStack_1e8);
      if (uVar3 == 4) {
        if (piStack_1c8 != (int *)0x0) {
          *piStack_1c8 = *piStack_1e8;
        }
        if (top != (int *)0x0) {
          *top = piStack_1e8[4];
        }
        if (right != (int *)0x0) {
          *right = piStack_1e8[2];
        }
        if (bottom != (int *)0x0) {
          *bottom = piStack_1e8[6];
        }
      }
      if (piStack_1e8 != (int *)0x0) {
        XFree();
      }
    }
    else {
      piStack_1e0 = top;
      piStack_1d8 = right;
      piStack_1d0 = bottom;
      memset(atStack_1b0,0,0xc0);
      atStack_1b0[0].tv_sec = CONCAT44(atStack_1b0[0].tv_sec._4_4_,0x21);
      uStack_190 = *(undefined8 *)(handle + 0x288);
      uStack_180 = 0x20;
      AStack_188 = AVar1;
      uStack_168 = 0;
      uStack_160 = 0;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_158 = 0;
      XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,atStack_1b0);
      dStack_1c0 = _glfwPlatformGetTime();
      dStack_1c0 = dStack_1c0 + 0.5;
      do {
        iVar2 = XCheckIfEvent(_glfw.x11.display,auStack_f0,isFrameExtentsEvent,handle);
        top = piStack_1e0;
        bottom = piStack_1d0;
        right = piStack_1d8;
        if (iVar2 != 0) goto LAB_0010acf5;
        dStack_1b8 = _glfwPlatformGetTime();
        dStack_1b8 = dStack_1c0 - dStack_1b8;
        if (dStack_1b8 <= 0.0) {
          _glfwInputError(0x10008,
                          "X11: The window manager has a broken _NET_REQUEST_FRAME_EXTENTS implementation; please report this issue"
                         );
        }
        else {
          atStack_1b0[0].tv_sec = 0;
          atStack_1b0[0].tv_usec = (__suseconds_t)(dStack_1b8 * 1000000.0);
          selectDisplayConnection(atStack_1b0);
        }
      } while (0.0 < dStack_1b8);
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwGetWindowFrameSize(GLFWwindow* handle,
                                    int* left, int* top,
                                    int* right, int* bottom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    if (left)
        *left = 0;
    if (top)
        *top = 0;
    if (right)
        *right = 0;
    if (bottom)
        *bottom = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowFrameSize(window, left, top, right, bottom);
}